

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::rp_basis(HModel *this)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  int var;
  ulong uVar5;
  
  printf("\nReporting current basis: numCol = %d; numRow = %d\n",(ulong)(uint)this->numCol,
         (ulong)(uint)this->numRow);
  if (0 < this->numCol) {
    puts("   Var    Col          Flag   Move");
    if (0 < this->numCol) {
      uVar5 = 0;
      do {
        uVar1 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5];
        if (uVar1 == 0) {
          printf("%6d %6d %6d\n",uVar5 & 0xffffffff,uVar5 & 0xffffffff,0);
        }
        else {
          printf("%6d %6d        %6d %6d\n",uVar5 & 0xffffffff,uVar5 & 0xffffffff,(ulong)uVar1,
                 (ulong)(uint)(this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar5]);
        }
        uVar5 = uVar5 + 1;
      } while ((long)uVar5 < (long)this->numCol);
    }
  }
  if (0 < this->numRow) {
    puts("   Var    Row  Basic   Flag   Move");
    if (0 < this->numRow) {
      uVar5 = 0;
      do {
        lVar4 = (uint)this->numCol + uVar5;
        lVar2 = (long)this->numCol + uVar5;
        uVar1 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar2];
        uVar3 = (ulong)(uint)(this->basicIndex).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar5];
        if (uVar1 == 0) {
          printf("%6d %6d %6d %6d\n",lVar4,uVar5 & 0xffffffff,uVar3,0);
        }
        else {
          printf("%6d %6d %6d %6d %6d\n",lVar4,uVar5 & 0xffffffff,uVar3,(ulong)uVar1,
                 (ulong)(uint)(this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[lVar2]);
        }
        uVar5 = uVar5 + 1;
      } while ((long)uVar5 < (long)this->numRow);
    }
  }
  return;
}

Assistant:

void HModel::rp_basis() {
  printf("\nReporting current basis: numCol = %d; numRow = %d\n", numCol, numRow);
  if (numCol>0) printf("   Var    Col          Flag   Move\n");
  for (int col=0; col < numCol; col++) {
    int var = col;
    if (nonbasicFlag[var])
      printf("%6d %6d        %6d %6d\n", var, col, nonbasicFlag[var], nonbasicMove[var]);
    else
      printf("%6d %6d %6d\n", var, col, nonbasicFlag[var]);
  }
  if (numRow>0) printf("   Var    Row  Basic   Flag   Move\n");
  for (int row=0; row < numRow; row++) {
    int var = numCol+row;
    if (nonbasicFlag[var])
      printf("%6d %6d %6d %6d %6d\n", var, row, basicIndex[row], nonbasicFlag[var], nonbasicMove[var]);
    else
      printf("%6d %6d %6d %6d\n", var, row, basicIndex[row], nonbasicFlag[var]);
  }
}